

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void writeSignature(ucvector *out)

{
  size_t sVar1;
  uint uVar2;
  size_t sVar3;
  
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = 0x89;
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = 'P';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = 'N';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = 'G';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = '\r';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = '\n';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = '\x1a';
  }
  sVar1 = out->size;
  sVar3 = sVar1 + 1;
  uVar2 = ucvector_reserve(out,sVar3);
  if (uVar2 != 0) {
    out->size = sVar3;
    out->data[sVar1] = '\n';
  }
  return;
}

Assistant:

static void writeSignature(ucvector* out)
{
  /*8 bytes PNG signature, aka the magic bytes*/
  ucvector_push_back(out, 137);
  ucvector_push_back(out, 80);
  ucvector_push_back(out, 78);
  ucvector_push_back(out, 71);
  ucvector_push_back(out, 13);
  ucvector_push_back(out, 10);
  ucvector_push_back(out, 26);
  ucvector_push_back(out, 10);
}